

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O0

void __thiscall FRemapTable::AddToTranslation(FRemapTable *this,char *range)

{
  int start_00;
  int end_00;
  int iVar1;
  int _g1;
  int _b1;
  int _r2;
  int _g2;
  undefined8 r1_00;
  undefined8 g1_00;
  undefined8 b1_00;
  undefined8 r2_00;
  undefined8 g2_00;
  size_t sVar2;
  CRecoverableError *err;
  double b2_1;
  double g2_1;
  double r2_1;
  double b1_1;
  double g1_1;
  double r1_1;
  int b2;
  int g2;
  int r2;
  int b1;
  int g1;
  int r1;
  int pal2;
  int pal1;
  undefined1 local_130 [8];
  FScanner sc;
  bool desaturated;
  int end;
  int start;
  char *range_local;
  FRemapTable *this_local;
  
  sc.Escape = false;
  FScanner::FScanner((FScanner *)local_130);
  sVar2 = strlen(range);
  FScanner::OpenMem((FScanner *)local_130,"translation",range,(int)sVar2);
  FScanner::SetCMode((FScanner *)local_130,true);
  FScanner::MustGetToken((FScanner *)local_130,0x104);
  start_00 = sc.StringLen;
  FScanner::MustGetToken((FScanner *)local_130,0x3a);
  FScanner::MustGetToken((FScanner *)local_130,0x104);
  end_00 = sc.StringLen;
  FScanner::MustGetToken((FScanner *)local_130,0x3d);
  if ((((start_00 < 0) || (0xff < start_00)) || (end_00 < 0)) || (0xff < end_00)) {
    FScanner::ScriptError((FScanner *)local_130,"Palette index out of range");
  }
  else {
    FScanner::MustGetAnyToken((FScanner *)local_130);
    if ((sc.String._4_4_ == 0x5b) || (sc.String._4_4_ == 0x25)) {
      if (sc.String._4_4_ == 0x5b) {
        FScanner::MustGetToken((FScanner *)local_130,0x104);
        iVar1 = sc.StringLen;
        FScanner::MustGetToken((FScanner *)local_130,0x2c);
        FScanner::MustGetToken((FScanner *)local_130,0x104);
        _g1 = sc.StringLen;
        FScanner::MustGetToken((FScanner *)local_130,0x2c);
        FScanner::MustGetToken((FScanner *)local_130,0x104);
        _b1 = sc.StringLen;
        FScanner::MustGetToken((FScanner *)local_130,0x5d);
        FScanner::MustGetToken((FScanner *)local_130,0x3a);
        FScanner::MustGetToken((FScanner *)local_130,0x5b);
        FScanner::MustGetToken((FScanner *)local_130,0x104);
        _r2 = sc.StringLen;
        FScanner::MustGetToken((FScanner *)local_130,0x2c);
        FScanner::MustGetToken((FScanner *)local_130,0x104);
        _g2 = sc.StringLen;
        FScanner::MustGetToken((FScanner *)local_130,0x2c);
        FScanner::MustGetToken((FScanner *)local_130,0x104);
        FScanner::MustGetToken((FScanner *)local_130,0x5d);
        AddColorRange(this,start_00,end_00,iVar1,_g1,_b1,_r2,_g2,sc.StringLen);
      }
      else if (sc.String._4_4_ == 0x25) {
        FScanner::MustGetToken((FScanner *)local_130,0x5b);
        FScanner::MustGetAnyToken((FScanner *)local_130);
        if (sc.String._4_4_ != 0x104) {
          FScanner::TokenMustBe((FScanner *)local_130,0x106);
        }
        r1_00 = sc._16_8_;
        FScanner::MustGetToken((FScanner *)local_130,0x2c);
        FScanner::MustGetAnyToken((FScanner *)local_130);
        if (sc.String._4_4_ != 0x104) {
          FScanner::TokenMustBe((FScanner *)local_130,0x106);
        }
        g1_00 = sc._16_8_;
        FScanner::MustGetToken((FScanner *)local_130,0x2c);
        FScanner::MustGetAnyToken((FScanner *)local_130);
        if (sc.String._4_4_ != 0x104) {
          FScanner::TokenMustBe((FScanner *)local_130,0x106);
        }
        b1_00 = sc._16_8_;
        FScanner::MustGetToken((FScanner *)local_130,0x5d);
        FScanner::MustGetToken((FScanner *)local_130,0x3a);
        FScanner::MustGetToken((FScanner *)local_130,0x5b);
        FScanner::MustGetAnyToken((FScanner *)local_130);
        if (sc.String._4_4_ != 0x104) {
          FScanner::TokenMustBe((FScanner *)local_130,0x106);
        }
        r2_00 = sc._16_8_;
        FScanner::MustGetToken((FScanner *)local_130,0x2c);
        FScanner::MustGetAnyToken((FScanner *)local_130);
        if (sc.String._4_4_ != 0x104) {
          FScanner::TokenMustBe((FScanner *)local_130,0x106);
        }
        g2_00 = sc._16_8_;
        FScanner::MustGetToken((FScanner *)local_130,0x2c);
        FScanner::MustGetAnyToken((FScanner *)local_130);
        if (sc.String._4_4_ != 0x104) {
          FScanner::TokenMustBe((FScanner *)local_130,0x106);
        }
        FScanner::MustGetToken((FScanner *)local_130,0x5d);
        AddDesaturation(this,start_00,end_00,(double)r1_00,(double)g1_00,(double)b1_00,(double)r2_00
                        ,(double)g2_00,(double)sc._16_8_);
      }
    }
    else {
      FScanner::TokenMustBe((FScanner *)local_130,0x104);
      iVar1 = sc.StringLen;
      FScanner::MustGetToken((FScanner *)local_130,0x3a);
      FScanner::MustGetToken((FScanner *)local_130,0x104);
      AddIndexRange(this,start_00,end_00,iVar1,sc.StringLen);
    }
  }
  FScanner::~FScanner((FScanner *)local_130);
  return;
}

Assistant:

void FRemapTable::AddToTranslation(const char *range)
{
	int start,end;
	bool desaturated = false;
	FScanner sc;

	sc.OpenMem("translation", range, int(strlen(range)));
	sc.SetCMode(true);

	try
	{
		sc.MustGetToken(TK_IntConst);
		start = sc.Number;
		sc.MustGetToken(':');
		sc.MustGetToken(TK_IntConst);
		end = sc.Number;
		sc.MustGetToken('=');
		if (start < 0 || start > 255 || end < 0 || end > 255)
		{
			sc.ScriptError("Palette index out of range");
			return;
		}

		sc.MustGetAnyToken();

		if (sc.TokenType != '[' && sc.TokenType != '%')
		{
			int pal1,pal2;

			sc.TokenMustBe(TK_IntConst);
			pal1 = sc.Number;
			sc.MustGetToken(':');
			sc.MustGetToken(TK_IntConst);
			pal2 = sc.Number;
			AddIndexRange(start, end, pal1, pal2);
		}
		else if (sc.TokenType == '[')
		{ 
			// translation using RGB values
			int r1,g1,b1,r2,g2,b2;

			sc.MustGetToken(TK_IntConst);
			r1 = sc.Number;
			sc.MustGetToken(',');

			sc.MustGetToken(TK_IntConst);
			g1 = sc.Number;
			sc.MustGetToken(',');

			sc.MustGetToken(TK_IntConst);
			b1 = sc.Number;
			sc.MustGetToken(']');
			sc.MustGetToken(':');
			sc.MustGetToken('[');

			sc.MustGetToken(TK_IntConst);
			r2 = sc.Number;
			sc.MustGetToken(',');

			sc.MustGetToken(TK_IntConst);
			g2 = sc.Number;
			sc.MustGetToken(',');

			sc.MustGetToken(TK_IntConst);
			b2 = sc.Number;
			sc.MustGetToken(']');

			AddColorRange(start, end, r1, g1, b1, r2, g2, b2);
		}
		else if (sc.TokenType == '%')
		{
			// translation using RGB values
			double r1,g1,b1,r2,g2,b2;

			sc.MustGetToken('[');
			sc.MustGetAnyToken();
			if (sc.TokenType != TK_IntConst) sc.TokenMustBe(TK_FloatConst);
			r1 = sc.Float;
			sc.MustGetToken(',');

			sc.MustGetAnyToken();
			if (sc.TokenType != TK_IntConst) sc.TokenMustBe(TK_FloatConst);
			g1 = sc.Float;
			sc.MustGetToken(',');

			sc.MustGetAnyToken();
			if (sc.TokenType != TK_IntConst) sc.TokenMustBe(TK_FloatConst);
			b1 = sc.Float;
			sc.MustGetToken(']');
			sc.MustGetToken(':');
			sc.MustGetToken('[');

			sc.MustGetAnyToken();
			if (sc.TokenType != TK_IntConst) sc.TokenMustBe(TK_FloatConst);
			r2 = sc.Float;
			sc.MustGetToken(',');

			sc.MustGetAnyToken();
			if (sc.TokenType != TK_IntConst) sc.TokenMustBe(TK_FloatConst);
			g2 = sc.Float;
			sc.MustGetToken(',');

			sc.MustGetAnyToken();
			if (sc.TokenType != TK_IntConst) sc.TokenMustBe(TK_FloatConst);
			b2 = sc.Float;
			sc.MustGetToken(']');

			AddDesaturation(start, end, r1, g1, b1, r2, g2, b2);
		}
	}
	catch (CRecoverableError &err)
	{
		Printf("Error in translation '%s':\n%s\n", range, err.GetMessage());
	}
}